

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfacet.hpp
# Opt level: O0

float EDX::Smith_G1(vec3f v,vec3f wm,float alpha)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 in_XMM2_Qa;
  float in_XMM3_Da;
  float in_XMM4_Da;
  vec3f vVar4;
  float root;
  float tanTheta;
  vec3f *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  vec3f local_60 [4];
  vec3f local_2c [2];
  vec3f local_10;
  float local_4;
  
  local_2c[0]._0_8_ = in_XMM2_Qa;
  local_2c[0].z = in_XMM3_Da;
  if (in_XMM3_Da < 0.0) {
    vVar4 = ::operator-((vec3f *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_60[0]._0_8_ = vVar4._0_8_;
    local_60[0].z = vVar4.z;
    local_2c[0].x = local_60[0].x;
    local_2c[0].y = local_60[0].y;
    local_2c[0].z = local_60[0].z;
  }
  fVar1 = TanTheta(in_stack_ffffffffffffff88);
  fVar1 = ABS(fVar1);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar2 = dot(&local_10,local_2c);
    fVar3 = CosTheta(&local_10);
    if (0.0 < fVar2 * fVar3) {
      fVar1 = sqrtf(in_XMM4_Da * fVar1 * in_XMM4_Da * fVar1 + 1.0);
      local_4 = 2.0 / (fVar1 + 1.0);
    }
    else {
      local_4 = 0.0;
    }
  }
  else {
    local_4 = 1.0;
  }
  return local_4;
}

Assistant:

inline float Smith_G1(vec3f v, vec3f wm, float alpha)
{
    if (wm.z < 0) wm = -wm;

    float tanTheta = fabs(TanTheta(v));

    if (tanTheta == 0.0f)
        return 1.0f;

    if (dot(v, wm) * CosTheta(v) <= 0)
        return 0.0f;

    float root = alpha * tanTheta;
    return 2.0f / (1.0f + sqrtf(1.0f + root*root));
}